

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::matrix3d>
          (Attribute *this,double t,matrix3d *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *__src;
  optional<tinyusdz::value::matrix3d> local_d8;
  undefined1 local_88 [8];
  optional<tinyusdz::value::matrix3d> v;
  TimeSampleInterpolationType tinterp_local;
  matrix3d *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (matrix3d *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 0x40),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 0x40));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<tinyusdz::value::matrix3d>(&local_d8,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::
      optional<tinyusdz::value::matrix3d,_0>
                ((optional<tinyusdz::value::matrix3d> *)local_88,&local_d8);
      nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::~optional(&local_d8);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_88);
      if (bVar1) {
        __src = nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::value
                          ((optional<tinyusdz::value::matrix3d> *)local_88);
        memcpy(dst,__src,0x48);
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::~optional
                ((optional<tinyusdz::value::matrix3d> *)local_88);
      if (bVar1) goto LAB_002fc2a6;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix3d>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::matrix3d>(this,dst);
    }
  }
LAB_002fc2a6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }